

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::anon_unknown_1::PosixColourImpl::~PosixColourImpl(PosixColourImpl *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

void use(Colour::Code _colourCode) override {
        switch (_colourCode) {
          case Colour::None:
          case Colour::White:
            return setColour("[0m");
          case Colour::Red:
            return setColour("[0;31m");
          case Colour::Green:
            return setColour("[0;32m");
          case Colour::Blue:
            return setColour("[0;34m");
          case Colour::Cyan:
            return setColour("[0;36m");
          case Colour::Yellow:
            return setColour("[0;33m");
          case Colour::Grey:
            return setColour("[1;30m");

          case Colour::LightGrey:
            return setColour("[0;37m");
          case Colour::BrightRed:
            return setColour("[1;31m");
          case Colour::BrightGreen:
            return setColour("[1;32m");
          case Colour::BrightWhite:
            return setColour("[1;37m");
          case Colour::BrightYellow:
            return setColour("[1;33m");

          case Colour::Bright:
            CATCH_INTERNAL_ERROR("not a colour");
          default:
            CATCH_INTERNAL_ERROR("Unknown colour requested");
        }
      }